

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool CLI::detail::split_windows_style(string *current,string *name,string *value)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  string *in_RDX;
  string *in_RSI;
  ulong in_RDI;
  size_type loc;
  string asStack_88 [32];
  string local_68 [32];
  string local_48 [32];
  long local_28;
  string *local_20;
  string *local_18;
  ulong local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar2 = ::std::__cxx11::string::size();
  if ((1 < uVar2) && (pcVar3 = (char *)::std::__cxx11::string::operator[](local_10), *pcVar3 == '/')
     ) {
    pcVar3 = (char *)::std::__cxx11::string::operator[](local_10);
    bVar1 = valid_first_char<char>(*pcVar3);
    if (bVar1) {
      local_28 = ::std::__cxx11::string::find_first_of((char)local_10,0x3a);
      if (local_28 == -1) {
        ::std::__cxx11::string::substr((ulong)asStack_88,local_10);
        ::std::__cxx11::string::operator=(local_18,asStack_88);
        ::std::__cxx11::string::~string(asStack_88);
        ::std::__cxx11::string::operator=(local_20,"");
      }
      else {
        ::std::__cxx11::string::substr((ulong)local_48,local_10);
        ::std::__cxx11::string::operator=(local_18,local_48);
        ::std::__cxx11::string::~string(local_48);
        ::std::__cxx11::string::substr((ulong)local_68,local_10);
        ::std::__cxx11::string::operator=(local_20,local_68);
        ::std::__cxx11::string::~string(local_68);
      }
      return true;
    }
  }
  return false;
}

Assistant:

CLI11_INLINE bool split_windows_style(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 1 && current[0] == '/' && valid_first_char(current[1])) {
        auto loc = current.find_first_of(':');
        if(loc != std::string::npos) {
            name = current.substr(1, loc - 1);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(1);
            value = "";
        }
        return true;
    }
    return false;
}